

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O2

void __thiscall embree::XMLWriter::store(XMLWriter *this,Ref<embree::SceneGraph::Node> *node)

{
  map<embree::Ref<embree::SceneGraph::Node>,_unsigned_long,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>_>_>
  *this_00;
  mapped_type_conflict1 id;
  Node *pNVar1;
  bool bVar2;
  iterator iVar3;
  ostream *poVar4;
  mapped_type_conflict1 *pmVar5;
  AnimatedLightNode *pAVar6;
  LightNode *pLVar7;
  TriangleMeshNode *pTVar8;
  QuadMeshNode *pQVar9;
  SubdivMeshNode *pSVar10;
  HairSetNode *pHVar11;
  AnimatedPerspectiveCameraNode *pAVar12;
  PerspectiveCameraNode *pPVar13;
  TransformNode *pTVar14;
  GroupNode *pGVar15;
  runtime_error *this_01;
  ssize_t id_00;
  ssize_t id_01;
  Ref<embree::SceneGraph::GroupNode> local_70;
  Ref<embree::SceneGraph::TransformNode> local_68;
  Ref<embree::SceneGraph::PerspectiveCameraNode> local_60;
  Ref<embree::SceneGraph::AnimatedPerspectiveCameraNode> local_58;
  Ref<embree::SceneGraph::HairSetNode> local_50;
  Ref<embree::SceneGraph::SubdivMeshNode> local_48;
  Ref<embree::SceneGraph::QuadMeshNode> local_40;
  Ref<embree::SceneGraph::TriangleMeshNode> local_38;
  Ref<embree::SceneGraph::LightNode> local_30;
  Ref<embree::SceneGraph::AnimatedLightNode> local_28;
  
  this_00 = &this->nodeMap;
  iVar3 = std::
          _Rb_tree<embree::Ref<embree::SceneGraph::Node>,_std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>,_std::_Select1st<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>_>_>
          ::find(&this_00->_M_t,node);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->nodeMap)._M_t._M_impl.super__Rb_tree_header) {
    id = this->currentNodeID;
    this->currentNodeID = id + 1;
    pmVar5 = std::
             map<embree::Ref<embree::SceneGraph::Node>,_unsigned_long,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>_>_>
             ::operator[](this_00,node);
    *pmVar5 = id;
    bVar2 = std::operator!=(&node->ptr->fileName,"");
    if (!bVar2) {
      pNVar1 = node->ptr;
      if (pNVar1 != (Node *)0x0) {
        pAVar6 = (AnimatedLightNode *)
                 __dynamic_cast(pNVar1,&SceneGraph::Node::typeinfo,
                                &SceneGraph::AnimatedLightNode::typeinfo,0);
        if (pAVar6 == (AnimatedLightNode *)0x0) {
          pLVar7 = (LightNode *)
                   __dynamic_cast(pNVar1,&SceneGraph::Node::typeinfo,
                                  &SceneGraph::LightNode::typeinfo,0);
          if (pLVar7 == (LightNode *)0x0) {
            pTVar8 = (TriangleMeshNode *)
                     __dynamic_cast(pNVar1,&SceneGraph::Node::typeinfo,
                                    &SceneGraph::TriangleMeshNode::typeinfo,0);
            if (pTVar8 == (TriangleMeshNode *)0x0) {
              pQVar9 = (QuadMeshNode *)
                       __dynamic_cast(pNVar1,&SceneGraph::Node::typeinfo,
                                      &SceneGraph::QuadMeshNode::typeinfo,0);
              if (pQVar9 == (QuadMeshNode *)0x0) {
                pSVar10 = (SubdivMeshNode *)
                          __dynamic_cast(pNVar1,&SceneGraph::Node::typeinfo,
                                         &SceneGraph::SubdivMeshNode::typeinfo,0);
                if (pSVar10 == (SubdivMeshNode *)0x0) {
                  pHVar11 = (HairSetNode *)
                            __dynamic_cast(pNVar1,&SceneGraph::Node::typeinfo,
                                           &SceneGraph::HairSetNode::typeinfo,0);
                  if (pHVar11 == (HairSetNode *)0x0) {
                    pAVar12 = (AnimatedPerspectiveCameraNode *)
                              __dynamic_cast(pNVar1,&SceneGraph::Node::typeinfo,
                                             &SceneGraph::AnimatedPerspectiveCameraNode::typeinfo,0)
                    ;
                    if (pAVar12 == (AnimatedPerspectiveCameraNode *)0x0) {
                      pPVar13 = (PerspectiveCameraNode *)
                                __dynamic_cast(pNVar1,&SceneGraph::Node::typeinfo,
                                               &SceneGraph::PerspectiveCameraNode::typeinfo,0);
                      if (pPVar13 == (PerspectiveCameraNode *)0x0) {
                        pTVar14 = (TransformNode *)
                                  __dynamic_cast(pNVar1,&SceneGraph::Node::typeinfo,
                                                 &SceneGraph::TransformNode::typeinfo,0);
                        if (pTVar14 == (TransformNode *)0x0) {
                          pGVar15 = (GroupNode *)
                                    __dynamic_cast(pNVar1,&SceneGraph::Node::typeinfo,
                                                   &SceneGraph::GroupNode::typeinfo,0);
                          if (pGVar15 == (GroupNode *)0x0) goto LAB_001886f6;
                          (*(pGVar15->super_Node).super_RefCount._vptr_RefCount[2])(pGVar15);
                          local_70.ptr = pGVar15;
                          (*(pGVar15->super_Node).super_RefCount._vptr_RefCount[2])(pGVar15);
                          store(this,&local_70,id);
                          (*(pGVar15->super_Node).super_RefCount._vptr_RefCount[3])(pGVar15);
                          (*(pGVar15->super_Node).super_RefCount._vptr_RefCount[3])(pGVar15);
                        }
                        else {
                          (*(pTVar14->super_Node).super_RefCount._vptr_RefCount[2])(pTVar14);
                          local_68.ptr = pTVar14;
                          (*(pTVar14->super_Node).super_RefCount._vptr_RefCount[2])(pTVar14);
                          store(this,&local_68,id);
                          (*(pTVar14->super_Node).super_RefCount._vptr_RefCount[3])(pTVar14);
                          (*(pTVar14->super_Node).super_RefCount._vptr_RefCount[3])(pTVar14);
                        }
                      }
                      else {
                        (*(pPVar13->super_Node).super_RefCount._vptr_RefCount[2])(pPVar13);
                        local_60.ptr = pPVar13;
                        (*(pPVar13->super_Node).super_RefCount._vptr_RefCount[2])(pPVar13);
                        store(this,&local_60,id);
                        (*(pPVar13->super_Node).super_RefCount._vptr_RefCount[3])(pPVar13);
                        (*(pPVar13->super_Node).super_RefCount._vptr_RefCount[3])(pPVar13);
                      }
                    }
                    else {
                      (*(pAVar12->super_PerspectiveCameraNode).super_Node.super_RefCount.
                        _vptr_RefCount[2])(pAVar12);
                      local_58.ptr = pAVar12;
                      (*(pAVar12->super_PerspectiveCameraNode).super_Node.super_RefCount.
                        _vptr_RefCount[2])(pAVar12);
                      store(this,&local_58,id_01);
                      (*(pAVar12->super_PerspectiveCameraNode).super_Node.super_RefCount.
                        _vptr_RefCount[3])(pAVar12);
                      (*(pAVar12->super_PerspectiveCameraNode).super_Node.super_RefCount.
                        _vptr_RefCount[3])(pAVar12);
                    }
                  }
                  else {
                    (*(pHVar11->super_Node).super_RefCount._vptr_RefCount[2])(pHVar11);
                    local_50.ptr = pHVar11;
                    (*(pHVar11->super_Node).super_RefCount._vptr_RefCount[2])(pHVar11);
                    store(this,&local_50,id);
                    (*(pHVar11->super_Node).super_RefCount._vptr_RefCount[3])(pHVar11);
                    (*(pHVar11->super_Node).super_RefCount._vptr_RefCount[3])(pHVar11);
                  }
                }
                else {
                  (*(pSVar10->super_Node).super_RefCount._vptr_RefCount[2])(pSVar10);
                  local_48.ptr = pSVar10;
                  (*(pSVar10->super_Node).super_RefCount._vptr_RefCount[2])(pSVar10);
                  store(this,&local_48,id);
                  (*(pSVar10->super_Node).super_RefCount._vptr_RefCount[3])(pSVar10);
                  (*(pSVar10->super_Node).super_RefCount._vptr_RefCount[3])(pSVar10);
                }
              }
              else {
                (*(pQVar9->super_Node).super_RefCount._vptr_RefCount[2])(pQVar9);
                local_40.ptr = pQVar9;
                (*(pQVar9->super_Node).super_RefCount._vptr_RefCount[2])(pQVar9);
                store(this,&local_40,id);
                (*(pQVar9->super_Node).super_RefCount._vptr_RefCount[3])(pQVar9);
                (*(pQVar9->super_Node).super_RefCount._vptr_RefCount[3])(pQVar9);
              }
            }
            else {
              (*(pTVar8->super_Node).super_RefCount._vptr_RefCount[2])(pTVar8);
              local_38.ptr = pTVar8;
              (*(pTVar8->super_Node).super_RefCount._vptr_RefCount[2])(pTVar8);
              store(this,&local_38,id);
              (*(pTVar8->super_Node).super_RefCount._vptr_RefCount[3])(pTVar8);
              (*(pTVar8->super_Node).super_RefCount._vptr_RefCount[3])(pTVar8);
            }
          }
          else {
            (*(pLVar7->super_Node).super_RefCount._vptr_RefCount[2])(pLVar7);
            local_30.ptr = pLVar7;
            (*(pLVar7->super_Node).super_RefCount._vptr_RefCount[2])(pLVar7);
            store(this,&local_30,id);
            (*(pLVar7->super_Node).super_RefCount._vptr_RefCount[3])(pLVar7);
            (*(pLVar7->super_Node).super_RefCount._vptr_RefCount[3])(pLVar7);
          }
        }
        else {
          (*(pAVar6->super_LightNode).super_Node.super_RefCount._vptr_RefCount[2])(pAVar6);
          local_28.ptr = pAVar6;
          (*(pAVar6->super_LightNode).super_Node.super_RefCount._vptr_RefCount[2])(pAVar6);
          store(this,&local_28,id_00);
          (*(pAVar6->super_LightNode).super_Node.super_RefCount._vptr_RefCount[3])(pAVar6);
          (*(pAVar6->super_LightNode).super_Node.super_RefCount._vptr_RefCount[3])(pAVar6);
        }
        return;
      }
LAB_001886f6:
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"unknown node type");
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tab(this);
    poVar4 = std::operator<<((ostream *)&this->field_0x10,"<extern id=\"");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    poVar4 = std::operator<<(poVar4,"\" src=\"");
    poVar4 = std::operator<<(poVar4,(string *)&node->ptr->fileName);
  }
  else {
    tab(this);
    poVar4 = std::operator<<((ostream *)&this->field_0x10,"<ref id=\"");
    std::
    map<embree::Ref<embree::SceneGraph::Node>,_unsigned_long,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>_>_>
    ::operator[](this_00,node);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  }
  poVar4 = std::operator<<(poVar4,"\"/>");
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

void XMLWriter::store(Ref<SceneGraph::Node> node)
  {
    if (nodeMap.find(node) != nodeMap.end()) {
      tab(); xml << "<ref id=\"" << nodeMap[node] << "\"/>" << std::endl; return;
    }
    
    const ssize_t id = nodeMap[node] = currentNodeID++;
    if (node->fileName != "") {
      tab(); xml << "<extern id=\"" << id << "\" src=\"" << node->fileName << "\"/>" << std::endl; return;
    }

    if      (Ref<SceneGraph::AnimatedLightNode> cnode = node.dynamicCast<SceneGraph::AnimatedLightNode>()) store(cnode,id);
    else if (Ref<SceneGraph::LightNode> cnode = node.dynamicCast<SceneGraph::LightNode>()) store(cnode,id);
    //else if (Ref<SceneGraph::MaterialNode> cnode = node.dynamicCast<SceneGraph::MaterialNode>()) store(cnode,id);
    else if (Ref<SceneGraph::TriangleMeshNode> cnode = node.dynamicCast<SceneGraph::TriangleMeshNode>()) store(cnode,id);
    else if (Ref<SceneGraph::QuadMeshNode> cnode = node.dynamicCast<SceneGraph::QuadMeshNode>()) store(cnode,id);
    else if (Ref<SceneGraph::SubdivMeshNode> cnode = node.dynamicCast<SceneGraph::SubdivMeshNode>()) store(cnode,id);
    else if (Ref<SceneGraph::HairSetNode> cnode = node.dynamicCast<SceneGraph::HairSetNode>()) store(cnode,id);
    else if (Ref<SceneGraph::AnimatedPerspectiveCameraNode> cnode = node.dynamicCast<SceneGraph::AnimatedPerspectiveCameraNode>()) store(cnode,id);
    else if (Ref<SceneGraph::PerspectiveCameraNode> cnode = node.dynamicCast<SceneGraph::PerspectiveCameraNode>()) store(cnode,id);
    else if (Ref<SceneGraph::TransformNode> cnode = node.dynamicCast<SceneGraph::TransformNode>()) store(cnode,id);
    else if (Ref<SceneGraph::GroupNode> cnode = node.dynamicCast<SceneGraph::GroupNode>()) store(cnode,id);
    else throw std::runtime_error("unknown node type");
  }